

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Location * __thiscall wabt::WastLexer::GetLocation(Location *__return_storage_ptr__,WastLexer *this)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  anon_class_8_1_8991fb9c column;
  int iVar4;
  
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  iVar1 = this->line_;
  iVar4 = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
  if (iVar4 < 2) {
    iVar4 = 1;
  }
  iVar3 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  (__return_storage_ptr__->filename)._M_len = (this->filename_)._M_string_length;
  (__return_storage_ptr__->filename)._M_str = pcVar2;
  (__return_storage_ptr__->field_1).field_0.line = iVar1;
  (__return_storage_ptr__->field_1).field_0.first_column = iVar4;
  (__return_storage_ptr__->field_1).field_0.last_column = iVar3;
  return __return_storage_ptr__;
}

Assistant:

Location WastLexer::GetLocation() {
  auto column = [this](const char* p) {
    return std::max(1, static_cast<int>(p - line_start_ + 1));
  };
  return Location(filename_, line_, column(token_start_), column(cursor_));
}